

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::FloatStateQueryTests::init(FloatStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int iVar2;
  GetBooleanVerifier *pGVar3;
  undefined4 extraout_var;
  GetIntegerVerifier *this_00;
  undefined4 extraout_var_00;
  GetFloatVerifier *this_01;
  undefined4 extraout_var_01;
  ApiCase *pAVar4;
  allocator<char> local_91;
  long local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  GetBooleanVerifier *local_48;
  GetIntegerVerifier *pGStack_40;
  GetFloatVerifier *local_38;
  
  pGVar3 = (GetBooleanVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (pGVar3,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = pGVar3;
  this_00 = (GetIntegerVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_00,(Functions *)CONCAT44(extraout_var_00,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_00;
  this_01 = (GetFloatVerifier *)operator_new(0x28);
  iVar2 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  FloatStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_01,iVar2),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = this_01;
  local_48 = this->m_verifierBoolean;
  pGStack_40 = this->m_verifierInteger;
  local_38 = this_01;
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"depth_range",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"DEPTH_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f178;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"line_width",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"LINE_WIDTH");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f1d0;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"polygon_offset_factor",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"POLYGON_OFFSET_FACTOR");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f228;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"polygon_offset_units",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"POLYGON_OFFSET_UNITS");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f280;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"sample_coverage_value",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"SAMPLE_COVERAGE_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f2d8;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"color_clear_value",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"COLOR_CLEAR_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f330;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"depth_clear_value",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"DEPTH_CLEAR_VALUE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f388;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"aliased_point_size_range",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"ALIASED_POINT_SIZE_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f3e0;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  for (local_90 = 0; local_90 != 3; local_90 = local_90 + 1) {
    pGVar3 = (&local_48)[local_90];
    pAVar4 = (ApiCase *)operator_new(0xa0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"aliased_line_width_range",&local_91);
    std::operator+(&local_88,&local_68,(pGVar3->super_StateVerifier).m_testNamePostfix);
    ApiCase::ApiCase(pAVar4,pCVar1,local_88._M_dataplus._M_p,"ALIASED_LINE_WIDTH_RANGE");
    (pAVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071f438;
    pAVar4[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar3;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar4);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return 3;
}

Assistant:

void FloatStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	FOR_EACH_VERIFIER(verifiers, addChild(new DepthRangeCase				(m_context, verifier,	(std::string("depth_range")					+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new LineWidthCase					(m_context, verifier,	(std::string("line_width")					+ verifier->getTestNamePostfix()).c_str(),	"LINE_WIDTH")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetFactorCase		(m_context, verifier,	(std::string("polygon_offset_factor")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_FACTOR")));
	FOR_EACH_VERIFIER(verifiers, addChild(new PolygonOffsetUnitsCase		(m_context, verifier,	(std::string("polygon_offset_units")		+ verifier->getTestNamePostfix()).c_str(),	"POLYGON_OFFSET_UNITS")));
	FOR_EACH_VERIFIER(verifiers, addChild(new SampleCoverageCase			(m_context, verifier,	(std::string("sample_coverage_value")		+ verifier->getTestNamePostfix()).c_str(),	"SAMPLE_COVERAGE_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new ColorClearCase				(m_context, verifier,	(std::string("color_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"COLOR_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new DepthClearCase				(m_context, verifier,	(std::string("depth_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"DEPTH_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedPointSizeRangeCase		(m_context, verifier,	(std::string("aliased_point_size_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_POINT_SIZE_RANGE")));
	FOR_EACH_VERIFIER(verifiers, addChild(new AliasedLineWidthRangeCase		(m_context, verifier,	(std::string("aliased_line_width_range")	+ verifier->getTestNamePostfix()).c_str(),	"ALIASED_LINE_WIDTH_RANGE")));
}